

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O1

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,true,false,false>>>
::
Chain_matrix<std::function<bool(unsigned_int,unsigned_int)>,std::function<bool(unsigned_int,unsigned_int)>>
          (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,true,false,false>>>
           *this,Column_settings *colSettings,
          function<bool_(unsigned_int,_unsigned_int)> *birthComparator,
          function<bool_(unsigned_int,_unsigned_int)> *deathComparator)

{
  _Any_data local_58;
  code *local_48;
  undefined8 uStack_40;
  _Any_data local_38;
  code *local_28;
  undefined8 uStack_20;
  
  std::function<bool_(unsigned_int,_unsigned_int)>::function
            ((function<bool_(unsigned_int,_unsigned_int)> *)&local_58,birthComparator);
  std::function<bool_(unsigned_int,_unsigned_int)>::function
            ((function<bool_(unsigned_int,_unsigned_int)> *)&local_38,deathComparator);
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = uStack_40;
  if (local_48 != (code *)0x0) {
    *(void **)this = local_58._M_unused._M_object;
    *(undefined8 *)(this + 8) = local_58._8_8_;
    *(code **)(this + 0x10) = local_48;
    local_48 = (code *)0x0;
    uStack_40 = 0;
  }
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 0;
  *(undefined8 *)(this + 0x38) = uStack_20;
  if (local_28 != (code *)0x0) {
    *(void **)(this + 0x20) = local_38._M_unused._M_object;
    *(undefined8 *)(this + 0x28) = local_38._8_8_;
    *(code **)(this + 0x30) = local_28;
    local_28 = (code *)0x0;
    uStack_20 = 0;
  }
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  *(Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,true,false,false>>>
    **)(this + 0x40) = this + 0x70;
  *(undefined8 *)(this + 0x48) = 1;
  *(undefined8 *)(this + 0x50) = 0;
  *(undefined8 *)(this + 0x58) = 0;
  *(undefined4 *)(this + 0x60) = 0x3f800000;
  *(undefined8 *)(this + 0x68) = 0;
  *(undefined8 *)(this + 0x70) = 0;
  *(Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,true,false,false>>>
    **)(this + 0x78) = this + 0xa8;
  *(undefined8 *)(this + 0x80) = 1;
  *(undefined8 *)(this + 0x88) = 0;
  *(undefined8 *)(this + 0x90) = 0;
  *(undefined4 *)(this + 0x98) = 0x3f800000;
  *(undefined8 *)(this + 0xa0) = 0;
  *(undefined8 *)(this + 0xa8) = 0;
  *(undefined4 *)(this + 0xb0) = 0;
  *(Column_settings **)(this + 0xb8) = colSettings;
  return;
}

Assistant:

inline Chain_matrix<Master_matrix>::Chain_matrix(Column_settings* colSettings,
                                                 const BirthComparatorFunction& birthComparator,
                                                 const DeathComparatorFunction& deathComparator)
    : Dim_opt(Master_matrix::template get_null_value<Dimension>()),
      Pair_opt(),
      Swap_opt(birthComparator, deathComparator),
      Rep_opt(),
      RA_opt(),
      nextIndex_(0),
      colSettings_(colSettings)
{}